

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O2

void __thiscall
QRhiGles2::trackedBufferBarrier
          (QRhiGles2 *this,QGles2CommandBuffer *cbD,QGles2Buffer *bufD,Access access)

{
  Access AVar1;
  Command *pCVar2;
  
  if ((((bufD->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
        super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 8) != 0) &&
     (AVar1 = (bufD->usageState).access, AVar1 != access)) {
    if (AVar1 - AccessStorageWrite < 3) {
      pCVar2 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(&cbD->commands);
      pCVar2->cmd = Barrier;
      (pCVar2->args).viewport.x = 1.22067e-41;
    }
    (bufD->usageState).access = access;
  }
  return;
}

Assistant:

constexpr inline bool testFlags(QFlags flags) const noexcept { return flags.i ? ((i & flags.i) == flags.i) : i == Int(0); }